

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

int __thiscall rlist::listIndex(rlist *this,void *value)

{
  int iVar1;
  int local_24;
  int index;
  void *value_local;
  rlist *this_local;
  
  local_24 = -1;
  if (this->rl->head != (listNode *)0x0) {
    this->view = this->rl->head;
    while (this->view != (listNode *)0x0) {
      local_24 = local_24 + 1;
      iVar1 = match(this,this->view,value);
      if (iVar1 != 0) {
        return local_24;
      }
      this->view = this->view->next;
    }
  }
  return local_24;
}

Assistant:

int rlist::listIndex(void *value){
    int index=-1;
    if(rl->head!=NULL){
        view=rl->head;
        while(view!=NULL){
            index++;
            if(rlist::match(view,value))
                return index;
            view=view->next;  
        }
    }
    return index;
}